

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiScene * aiImportFileExWithProperties(char *pFile,uint pFlags,aiFileIO *pFS,aiPropertyStore *props)

{
  Importer *this;
  ImporterPimpl *pIVar1;
  CIOSystemWrapper *this_00;
  aiScene *in;
  ScenePrivateData *pSVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  aiPropertyStore *num_bytes;
  ScenePrivateData *priv;
  ImporterPimpl *pimpl;
  PropertyMap *pp;
  Importer *imp;
  aiScene *scene;
  aiPropertyStore *props_local;
  aiFileIO *pFS_local;
  uint pFlags_local;
  char *pFile_local;
  
  num_bytes = (aiPropertyStore *)CONCAT44(in_register_00000034,pFlags);
  if (pFile == (char *)0x0) {
    __assert_fail("__null != pFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0xa9,
                  "const aiScene *aiImportFileExWithProperties(const char *, unsigned int, aiFileIO *, const aiPropertyStore *)"
                 );
  }
  this = (Importer *)operator_new(8);
  Assimp::Importer::Importer(this);
  if (props != (aiPropertyStore *)0x0) {
    pIVar1 = Assimp::Importer::Pimpl(this);
    std::
    map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::operator=(&pIVar1->mIntProperties,
                (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)props);
    std::
    map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::operator=(&pIVar1->mFloatProperties,
                (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                 *)(props + 0x30));
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&pIVar1->mStringProperties,
                (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(props + 0x60));
    num_bytes = props + 0x90;
    std::
    map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::operator=(&pIVar1->mMatrixProperties,
                (map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                 *)num_bytes);
  }
  if (pFS != (aiFileIO *)0x0) {
    this_00 = (CIOSystemWrapper *)
              Assimp::Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,(size_t)num_bytes);
    Assimp::CIOSystemWrapper::CIOSystemWrapper(this_00,pFS);
    Assimp::Importer::SetIOHandler(this,(IOSystem *)this_00);
  }
  in = Assimp::Importer::ReadFile(this,pFile,pFlags);
  if (in == (aiScene *)0x0) {
    pcVar3 = Assimp::Importer::GetErrorString(this);
    std::__cxx11::string::operator=((string *)Assimp::gLastErrorString_abi_cxx11_,pcVar3);
    if (this != (Importer *)0x0) {
      Assimp::Importer::~Importer(this);
      operator_delete(this,8);
    }
  }
  else {
    pSVar2 = Assimp::ScenePriv(in);
    pSVar2->mOrigImporter = this;
  }
  return in;
}

Assistant:

const aiScene* aiImportFileExWithProperties( const char* pFile, unsigned int pFlags, 
        aiFileIO* pFS, const aiPropertyStore* props) {
    ai_assert(NULL != pFile);

    const aiScene* scene = NULL;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // create an Importer for this file
    Assimp::Importer* imp = new Assimp::Importer();

    // copy properties
    if(props) {
        const PropertyMap* pp = reinterpret_cast<const PropertyMap*>(props);
        ImporterPimpl* pimpl = imp->Pimpl();
        pimpl->mIntProperties = pp->ints;
        pimpl->mFloatProperties = pp->floats;
        pimpl->mStringProperties = pp->strings;
        pimpl->mMatrixProperties = pp->matrices;
    }
    // setup a custom IO system if necessary
    if (pFS) {
        imp->SetIOHandler( new CIOSystemWrapper (pFS) );
    }

    // and have it read the file
    scene = imp->ReadFile( pFile, pFlags);

    // if succeeded, store the importer in the scene and keep it alive
    if( scene)  {
        ScenePrivateData* priv = const_cast<ScenePrivateData*>( ScenePriv(scene) );
        priv->mOrigImporter = imp;
    } else {
        // if failed, extract error code and destroy the import
        gLastErrorString = imp->GetErrorString();
        delete imp;
    }

    // return imported data. If the import failed the pointer is NULL anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    
    return scene;
}